

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O2

base_learner * baseline_setup(options_i *options,vw *all)

{
  bool bVar1;
  option_group_definition *poVar2;
  example *peVar3;
  base_learner *l;
  single_learner *base;
  learner<baseline,_example> *plVar4;
  bool baseline_option;
  allocator local_6a8;
  allocator local_6a7;
  allocator local_6a6;
  allocator local_6a5;
  allocator local_6a4;
  allocator local_6a3;
  allocator local_6a2;
  allocator local_6a1;
  free_ptr<baseline> data;
  string local_690 [32];
  string local_670;
  string local_650 [32];
  string local_630;
  string local_610 [32];
  string local_5f0;
  string local_5d0 [32];
  string local_5b0;
  string local_590;
  string loss_function;
  option_group_definition new_options;
  string loss_function_type;
  string local_4e8 [64];
  bool local_4a8;
  undefined1 local_478 [112];
  bool local_408;
  undefined1 local_3d8 [112];
  bool local_368;
  undefined1 local_338 [160];
  typed_option<bool> local_298;
  typed_option<bool> local_1f8;
  typed_option<float> local_158;
  typed_option<bool> local_b8;
  
  scoped_calloc_or_throw<baseline>();
  baseline_option = false;
  loss_function._M_dataplus._M_p = (pointer)&loss_function.field_2;
  loss_function._M_string_length = 0;
  loss_function.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&local_590,"Baseline options",(allocator *)&loss_function_type);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::string((string *)&local_5b0,"baseline",&local_6a1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&loss_function_type,&local_5b0,&baseline_option);
  local_4a8 = true;
  std::__cxx11::string::string
            (local_5d0,
             "Learn an additive baseline (from constant features) and a residual separately in regression."
             ,&local_6a2);
  std::__cxx11::string::_M_assign(local_4e8);
  VW::config::typed_option<bool>::typed_option(&local_b8,(typed_option<bool> *)&loss_function_type);
  poVar2 = VW::config::option_group_definition::add<bool>(&new_options,&local_b8);
  std::__cxx11::string::string((string *)&local_5f0,"lr_multiplier",&local_6a3);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_338,&local_5f0,
             &(data._M_t.super___uniq_ptr_impl<baseline,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_baseline_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_baseline_*,_false>._M_head_impl)->lr_multiplier);
  std::__cxx11::string::string(local_610,"learning rate multiplier for baseline model",&local_6a4);
  std::__cxx11::string::_M_assign((string *)(local_338 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_158,(typed_option<float> *)local_338);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_158);
  std::__cxx11::string::string((string *)&local_630,"global_only",&local_6a5);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3d8,&local_630,
             &(data._M_t.super___uniq_ptr_impl<baseline,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_baseline_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_baseline_*,_false>._M_head_impl)->global_only);
  local_368 = true;
  std::__cxx11::string::string
            (local_650,"use separate example with only global constant for baseline predictions",
             &local_6a6);
  std::__cxx11::string::_M_assign((string *)(local_3d8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_1f8,(typed_option<bool> *)local_3d8);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_1f8);
  std::__cxx11::string::string((string *)&local_670,"check_enabled",&local_6a7);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_478,&local_670,
             &(data._M_t.super___uniq_ptr_impl<baseline,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_baseline_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_baseline_*,_false>._M_head_impl)->check_enabled);
  local_408 = true;
  std::__cxx11::string::string
            (local_690,"only use baseline when the example contains enabled flag",&local_6a8);
  std::__cxx11::string::_M_assign((string *)(local_478 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_298,(typed_option<bool> *)local_478);
  VW::config::option_group_definition::add<bool>(poVar2,&local_298);
  VW::config::typed_option<bool>::~typed_option(&local_298);
  std::__cxx11::string::~string(local_690);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_478);
  std::__cxx11::string::~string((string *)&local_670);
  VW::config::typed_option<bool>::~typed_option(&local_1f8);
  std::__cxx11::string::~string(local_650);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_3d8);
  std::__cxx11::string::~string((string *)&local_630);
  VW::config::typed_option<float>::~typed_option(&local_158);
  std::__cxx11::string::~string(local_610);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_338);
  std::__cxx11::string::~string((string *)&local_5f0);
  VW::config::typed_option<bool>::~typed_option(&local_b8);
  std::__cxx11::string::~string(local_5d0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&loss_function_type);
  std::__cxx11::string::~string((string *)&local_5b0);
  (**options->_vptr_options_i)(options,&new_options);
  if (baseline_option == false) {
    plVar4 = (learner<baseline,_example> *)0x0;
  }
  else {
    peVar3 = VW::alloc_examples(simple_label.label_size,1);
    (data._M_t.super___uniq_ptr_impl<baseline,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_baseline_*,_void_(*)(void_*)>.super__Head_base<0UL,_baseline_*,_false>.
    _M_head_impl)->ec = peVar3;
    (data._M_t.super___uniq_ptr_impl<baseline,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_baseline_*,_void_(*)(void_*)>.super__Head_base<0UL,_baseline_*,_false>.
    _M_head_impl)->ec->in_use = true;
    (data._M_t.super___uniq_ptr_impl<baseline,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_baseline_*,_void_(*)(void_*)>.super__Head_base<0UL,_baseline_*,_false>.
    _M_head_impl)->all = all;
    (**all->loss->_vptr_loss_function)(&loss_function_type);
    bVar1 = std::operator!=(&loss_function_type,"logistic");
    if (bVar1) {
      (data._M_t.super___uniq_ptr_impl<baseline,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_baseline_*,_void_(*)(void_*)>.super__Head_base<0UL,_baseline_*,_false>
      ._M_head_impl)->lr_scaling = true;
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar4 = LEARNER::init_learner<baseline,example,LEARNER::learner<char,example>>
                       (&data,base,predict_or_learn<true>,predict_or_learn<false>);
    *(undefined8 *)(plVar4 + 0x48) = *(undefined8 *)(plVar4 + 0x18);
    *(code **)(plVar4 + 0x50) = sensitivity;
    *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = finish;
    std::__cxx11::string::~string((string *)&loss_function_type);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&loss_function);
  std::unique_ptr<baseline,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar4;
}

Assistant:

base_learner* baseline_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<baseline>();
  bool baseline_option = false;
  std::string loss_function;

  option_group_definition new_options("Baseline options");
  new_options
      .add(make_option("baseline", baseline_option)
               .keep()
               .help("Learn an additive baseline (from constant features) and a residual separately in regression."))
      .add(make_option("lr_multiplier", data->lr_multiplier).help("learning rate multiplier for baseline model"))
      .add(make_option("global_only", data->global_only)
               .keep()
               .help("use separate example with only global constant for baseline predictions"))
      .add(make_option("check_enabled", data->check_enabled)
               .keep()
               .help("only use baseline when the example contains enabled flag"));
  options.add_and_parse(new_options);

  if (!baseline_option)
    return nullptr;

  // initialize baseline example
  data->ec = VW::alloc_examples(simple_label.label_size, 1);
  data->ec->in_use = true;
  data->all = &all;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "logistic")
    data->lr_scaling = true;

  auto base = as_singleline(setup_base(options, all));

  learner<baseline, example>& l = init_learner(data, base, predict_or_learn<true>, predict_or_learn<false>);

  l.set_sensitivity(sensitivity);
  l.set_finish(finish);

  return make_base(l);
}